

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable-common.h
# Opt level: O0

void __thiscall
google::sparsehash_internal::
sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>::
sh_hashtable_settings
          (sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4> *this,
          hasher *hf,float ht_occupancy_flt,float ht_empty_flt)

{
  sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4> *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  
  in_RDI->enlarge_threshold_ = 0;
  in_RDI->shrink_threshold_ = 0;
  in_RDI->consider_shrink_ = false;
  in_RDI->use_empty_ = false;
  in_RDI->use_deleted_ = false;
  in_RDI->num_ht_copies_ = 0;
  set_enlarge_factor(in_RDI,in_XMM0_Da);
  set_shrink_factor(in_RDI,in_XMM1_Da);
  return;
}

Assistant:

sh_hashtable_settings(const hasher& hf, const float ht_occupancy_flt,
                        const float ht_empty_flt)
      : hasher(hf),
        enlarge_threshold_(0),
        shrink_threshold_(0),
        consider_shrink_(false),
        use_empty_(false),
        use_deleted_(false),
        num_ht_copies_(0) {
    set_enlarge_factor(ht_occupancy_flt);
    set_shrink_factor(ht_empty_flt);
  }